

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitLdArrayBuffer(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  ViewType viewType;
  code *pcVar1;
  EmitExpressionInfo EVar2;
  bool bVar3;
  EmitInfoBase value;
  ParseNode *this_00;
  ParseNode *indexNode;
  IdentPtr name;
  AsmJsSymbol *sym;
  AsmJsArrayView *pAVar4;
  undefined4 *puVar5;
  AsmJsCompilationException *this_01;
  EmitExpressionInfo local_48;
  EmitExpressionInfo indexInfo;
  uint32 indexSlot;
  EmitExpressionInfo info;
  OpCodeAsmJs op;
  
  this_00 = ParserWrapper::GetBinaryLeft(pnode);
  indexNode = ParserWrapper::GetBinaryRight(pnode);
  if ((this_00->nop == knopName) || (this_00->nop == knopStr)) {
    name = ParseNode::name(this_00);
    sym = AsmJsModuleCompiler::LookupIdentifier(this->mCompiler,name,this->mFunction,(Source *)0x0);
    if ((sym != (AsmJsSymbol *)0x0) && (sym->mType == ArrayView)) {
      pAVar4 = AsmJsArrayView::FromSymbol(sym);
      viewType = (pAVar4->super_AsmJsSymbol).field_0x14;
      indexInfo.type.which_ = Int;
      local_48 = EmitTypedArrayIndex(this,indexNode,(OpCodeAsmJs *)((long)&info.type.which_ + 2),
                                     &indexInfo.type.which_,viewType,LoadTypedArray);
      AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_48);
      indexSlot = (**(pAVar4->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar4);
      bVar3 = AsmJsType::isIntish((AsmJsType *)&indexSlot);
      if (bVar3) {
        value.location = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
      }
      else {
        bVar3 = AsmJsType::isMaybeFloat((AsmJsType *)&indexSlot);
        if (bVar3) {
          value.location = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
        }
        else {
          bVar3 = AsmJsType::isMaybeDouble((AsmJsType *)&indexSlot);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x696,"(info.type.isMaybeDouble())",
                                        "info.type.isMaybeDouble()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
          value.location = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
        }
      }
      AsmJsByteCodeWriter::AsmTypedArr
                (&this->mWriter,info.type.which_._2_2_,value.location,indexInfo.type.which_,viewType
                );
      EVar2.type.which_ = indexSlot;
      EVar2.super_EmitInfoBase.location = value.location;
      return EVar2;
    }
    this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_01,L"Invalid identifier %s",&name->field_0x22);
  }
  else {
    this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException(this_01,L"Invalid symbol ");
  }
  __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitLdArrayBuffer( ParseNode * pnode )
    {
        ParseNode* arrayNameNode = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* indexNode = ParserWrapper::GetBinaryRight( pnode );
        if( !ParserWrapper::IsNameDeclaration( arrayNameNode ) )
        {
            throw AsmJsCompilationException( _u("Invalid symbol ") );
        }

        PropertyName name = arrayNameNode->name();
        AsmJsSymbol* sym = mCompiler->LookupIdentifier(name, mFunction);
        if(!AsmJsArrayView::Is(sym))
        {
            throw AsmJsCompilationException( _u("Invalid identifier %s"), name->Psz() );
        }
        AsmJsArrayView* arrayView = AsmJsArrayView::FromSymbol(sym);
        ArrayBufferView::ViewType viewType = arrayView->GetViewType();

        OpCodeAsmJs op;
        uint32 indexSlot = 0;
        EmitExpressionInfo indexInfo = EmitTypedArrayIndex(indexNode, op, indexSlot, viewType, LoadTypedArray);
        mFunction->ReleaseLocationGeneric(&indexInfo);

        EmitExpressionInfo info( arrayView->GetType() );
        if( info.type.isIntish() )
        {
            info.location = mFunction->AcquireTmpRegister<int>();
        }
        else if (info.type.isMaybeFloat())
        {
            info.location = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            Assert(info.type.isMaybeDouble());
            info.location = mFunction->AcquireTmpRegister<double>();
        }
        mWriter.AsmTypedArr( op, info.location, indexSlot, viewType );

        return info;
    }